

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O2

QString * QLockFilePrivate::processNameByPid(QString *__return_storage_ptr__,qint64 pid)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QArrayDataPointer<char> local_b8;
  QFileSystemEntry local_a0;
  char exePath [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = qt_haveLinuxProcfs();
  if (bVar2) {
    exePath[0x30] = -0x56;
    exePath[0x31] = -0x56;
    exePath[0x32] = -0x56;
    exePath[0x33] = -0x56;
    exePath[0x34] = -0x56;
    exePath[0x35] = -0x56;
    exePath[0x36] = -0x56;
    exePath[0x37] = -0x56;
    exePath[0x38] = -0x56;
    exePath[0x39] = -0x56;
    exePath[0x3a] = -0x56;
    exePath[0x3b] = -0x56;
    exePath[0x3c] = -0x56;
    exePath[0x3d] = -0x56;
    exePath[0x3e] = -0x56;
    exePath[0x3f] = -0x56;
    exePath[0x20] = -0x56;
    exePath[0x21] = -0x56;
    exePath[0x22] = -0x56;
    exePath[0x23] = -0x56;
    exePath[0x24] = -0x56;
    exePath[0x25] = -0x56;
    exePath[0x26] = -0x56;
    exePath[0x27] = -0x56;
    exePath[0x28] = -0x56;
    exePath[0x29] = -0x56;
    exePath[0x2a] = -0x56;
    exePath[0x2b] = -0x56;
    exePath[0x2c] = -0x56;
    exePath[0x2d] = -0x56;
    exePath[0x2e] = -0x56;
    exePath[0x2f] = -0x56;
    exePath[0x10] = -0x56;
    exePath[0x11] = -0x56;
    exePath[0x12] = -0x56;
    exePath[0x13] = -0x56;
    exePath[0x14] = -0x56;
    exePath[0x15] = -0x56;
    exePath[0x16] = -0x56;
    exePath[0x17] = -0x56;
    exePath[0x18] = -0x56;
    exePath[0x19] = -0x56;
    exePath[0x1a] = -0x56;
    exePath[0x1b] = -0x56;
    exePath[0x1c] = -0x56;
    exePath[0x1d] = -0x56;
    exePath[0x1e] = -0x56;
    exePath[0x1f] = -0x56;
    exePath[0] = -0x56;
    exePath[1] = -0x56;
    exePath[2] = -0x56;
    exePath[3] = -0x56;
    exePath[4] = -0x56;
    exePath[5] = -0x56;
    exePath[6] = -0x56;
    exePath[7] = -0x56;
    exePath[8] = -0x56;
    exePath[9] = -0x56;
    exePath[10] = -0x56;
    exePath[0xb] = -0x56;
    exePath[0xc] = -0x56;
    exePath[0xd] = -0x56;
    exePath[0xe] = -0x56;
    exePath[0xf] = -0x56;
    sprintf(exePath,"/proc/%lld/exe",pid);
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qt_readlink((QByteArray *)&local_b8,exePath);
    if ((undefined1 *)local_b8.size == (undefined1 *)0x0) {
      local_a0.m_filePath.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      local_a0.m_filePath.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).ptr = L"/ERROR/";
      local_a0.m_filePath.d.size = 0;
      (__return_storage_ptr__->d).size = 7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    }
    else {
      qVar3 = QByteArrayView::lengthHelperCharArray(" (deleted)",0xb);
      bv.m_data = " (deleted)";
      bv.m_size = qVar3;
      bVar2 = QByteArray::endsWith((QByteArray *)&local_b8,bv);
      if (bVar2) {
        QByteArray::chop((QByteArray *)&local_b8,10);
      }
      QFileSystemEntry::QFileSystemEntry(&local_a0,&local_b8);
      QFileSystemEntry::fileName(__return_storage_ptr__,&local_a0);
      QFileSystemEntry::~QFileSystemEntry(&local_a0);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00379cbd:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00379cbd;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLockFilePrivate::processNameByPid(qint64 pid)
{
#if defined(Q_OS_MACOS)
    char name[1024];
    proc_name(pid, name, sizeof(name) / sizeof(char));
    return QFile::decodeName(name);
#elif defined(Q_OS_LINUX)
    if (!qt_haveLinuxProcfs())
        return QString();

    char exePath[64];
    sprintf(exePath, "/proc/%lld/exe", pid);

    QByteArray buf = qt_readlink(exePath);
    if (buf.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }

    // remove the " (deleted)" suffix, if any
    static const char deleted[] = " (deleted)";
    if (buf.endsWith(deleted))
        buf.chop(strlen(deleted));

    return QFileSystemEntry(buf, QFileSystemEntry::FromNativePath()).fileName();
#elif defined(Q_OS_HAIKU)
    thread_info info;
    if (get_thread_info(pid, &info) != B_OK)
        return QString();
    return QFile::decodeName(info.name);
#elif defined(Q_OS_BSD4) && !defined(QT_PLATFORM_UIKIT)
# if defined(Q_OS_NETBSD)
    struct kinfo_proc2 kp;
    int mib[6] = { CTL_KERN, KERN_PROC2, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc2), 1 };
# elif defined(Q_OS_OPENBSD)
    struct kinfo_proc kp;
    int mib[6] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc), 1 };
# else
    struct kinfo_proc kp;
    int mib[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid };
# endif
    size_t len = sizeof(kp);
    u_int mib_len = sizeof(mib)/sizeof(u_int);

    if (sysctl(mib, mib_len, &kp, &len, NULL, 0) < 0)
        return QString();

# if defined(Q_OS_OPENBSD) || defined(Q_OS_NETBSD)
    if (kp.p_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.p_comm);
# else
    if (kp.ki_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.ki_comm);
# endif
    return name;
#elif defined(Q_OS_QNX)
    char exePath[PATH_MAX];
    sprintf(exePath, "/proc/%lld/exefile", pid);

    int fd = qt_safe_open(exePath, O_RDONLY);
    if (fd == -1)
        return QString();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QString();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size - 1));
    if (buffer.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }
    return QFileSystemEntry(buffer, QFileSystemEntry::FromNativePath()).fileName();
#else
    Q_UNUSED(pid);
    return QString();
#endif
}